

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::IncrementTimestamp(RTPSession *this,uint32_t inc)

{
  int status;
  uint32_t inc_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTPPacketBuilder::IncrementTimestamp(&this->packetbuilder,inc);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::IncrementTimestamp(uint32_t inc)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.IncrementTimestamp(inc);
	BUILDER_UNLOCK
	return status;
}